

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

iteration_time __thiscall
helics::CommonCore::enterExecutingMode
          (CommonCore *this,LocalFederateId federateID,IterationRequest iterate)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  FederateStates FVar1;
  bool bVar2;
  BrokerState BVar3;
  FederateState *this_00;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  iteration_time iVar5;
  ActionMessage exec;
  ActionMessage terminate;
  BrokerState cBrokerState;
  FederateState *fed;
  undefined7 in_stack_fffffffffffffce8;
  IterationRequest in_stack_fffffffffffffcef;
  FederateState *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  memory_order __m;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  action_t in_stack_fffffffffffffd0c;
  undefined1 *puVar6;
  char *in_stack_fffffffffffffd10;
  FederateState *this_01;
  CommonCore *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  ActionMessage local_2a8;
  BaseType local_1f0;
  BaseType local_1ec;
  undefined1 local_1e8 [8];
  BaseType local_1e0;
  BaseType local_1d8;
  undefined1 in_stack_fffffffffffffe2e;
  IterationRequest in_stack_fffffffffffffe2f;
  FederateState *in_stack_fffffffffffffe30;
  Time local_10;
  IterationResult local_8;
  
  this_00 = getFederateAt(in_stack_fffffffffffffd28,
                          (LocalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  if (this_00 == (FederateState *)0x0) {
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffd00,
               (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    message._M_len._4_4_ = in_stack_fffffffffffffd0c;
    message._M_len._0_4_ = in_stack_fffffffffffffd08;
    message._M_str = in_stack_fffffffffffffd10;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffd00,message);
    __cxa_throw(uVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  FVar1 = FederateState::getState((FederateState *)0x463c3b);
  if (FVar1 == EXECUTING) {
    local_10 = FederateState::grantedTime(this_00);
    local_8 = NEXT_STEP;
    uVar4 = extraout_RDX;
  }
  else {
    FVar1 = FederateState::getState((FederateState *)0x463c72);
    if (FVar1 != INITIALIZING) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd00,
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      message_00._M_len._4_4_ = in_stack_fffffffffffffd0c;
      message_00._M_len._0_4_ = in_stack_fffffffffffffd08;
      message_00._M_str = in_stack_fffffffffffffd10;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_fffffffffffffd00,message_00);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    bVar2 = FederateState::isCallbackFederate(this_00);
    if (bVar2) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd00,
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      message_01._M_len._4_4_ = in_stack_fffffffffffffd0c;
      message_01._M_len._0_4_ = in_stack_fffffffffffffd08;
      message_01._M_str = in_stack_fffffffffffffd10;
      InvalidFunctionCall::InvalidFunctionCall
                ((InvalidFunctionCall *)in_stack_fffffffffffffd00,message_01);
      __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
    }
    this_01 = this_00;
    ActionMessage::ActionMessage((ActionMessage *)this_00,in_stack_fffffffffffffd0c);
    FederateState::addAction
              (in_stack_fffffffffffffcf0,
               (ActionMessage *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcf0);
    BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x463d87);
    puVar6 = (undefined1 *)((ulong)(uint)in_stack_fffffffffffffd0c << 0x20);
    if ((ushort)(BVar3 + CONNECTED) < 5) {
      puVar6 = local_1e8;
      ActionMessage::ActionMessage((ActionMessage *)this_01,(action_t)((ulong)puVar6 >> 0x20));
      local_1ec = (BaseType)
                  std::atomic::operator_cast_to_GlobalFederateId
                            ((atomic<helics::GlobalFederateId> *)
                             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      local_1d8 = local_1ec;
      local_1f0 = (BaseType)
                  std::atomic::operator_cast_to_GlobalFederateId
                            ((atomic<helics::GlobalFederateId> *)
                             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      local_1e0 = local_1f0;
      FederateState::addAction
                (in_stack_fffffffffffffcf0,
                 (ActionMessage *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcf0);
    }
    ActionMessage::ActionMessage((ActionMessage *)this_01,(action_t)((ulong)puVar6 >> 0x20));
    __m = seq_cst;
    local_2a8.source_id = std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,seq_cst);
    local_2a8.dest_id = std::atomic<helics::GlobalFederateId>::load(&this_00->global_id,__m);
    setIterationFlags((ActionMessage *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcef);
    setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_2a8,indicator_flag);
    BrokerBase::addActionMessage
              ((BrokerBase *)in_stack_fffffffffffffcf0,
               (ActionMessage *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    iVar5 = FederateState::enterExecutingMode
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f,
                       (bool)in_stack_fffffffffffffe2e);
    local_10 = iVar5.grantedTime.internalTimeCode;
    local_8 = iVar5.state;
    ActionMessage::~ActionMessage((ActionMessage *)local_10.internalTimeCode);
    uVar4 = extraout_RDX_00;
  }
  iVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  iVar5.state = local_8;
  iVar5.grantedTime.internalTimeCode = local_10.internalTimeCode;
  return iVar5;
}

Assistant:

iteration_time CommonCore::enterExecutingMode(LocalFederateId federateID, IterationRequest iterate)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (EnterExecutingState)"));
    }
    if (FederateStates::EXECUTING == fed->getState()) {
        return {fed->grantedTime(), IterationResult::NEXT_STEP};
    }
    if (FederateStates::INITIALIZING != fed->getState()) {
        throw(InvalidFunctionCall("federate is in invalid state for calling entry to exec mode"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "enterExecutingMode is not permitted for callback based federates"));
    }
    // do an exec check on the fed to process previously received messages so it can't get in a
    // deadlocked state
    fed->addAction(CMD_EXEC_CHECK);

    // do a check on the core to make sure it isn't stopped
    auto cBrokerState = getBrokerState();
    switch (cBrokerState) {
        case BrokerState::TERMINATING:
        case BrokerState::TERMINATED:
        case BrokerState::TERMINATING_ERROR:
        case BrokerState::CONNECTED_ERROR:
        case BrokerState::ERRORED: {
            ActionMessage terminate(CMD_STOP);
            terminate.dest_id = fed->global_id;
            terminate.source_id = fed->global_id;
            fed->addAction(terminate);
        } break;
        default:
            break;
    }

    ActionMessage exec(CMD_EXEC_REQUEST);
    exec.source_id = fed->global_id.load();
    exec.dest_id = fed->global_id.load();
    setIterationFlags(exec, iterate);
    setActionFlag(exec, indicator_flag);
    addActionMessage(exec);

    return fed->enterExecutingMode(iterate, false);
}